

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall Timer::start(Timer *this)

{
  Runnable<Timer> *this_00;
  
  if (this->mClockThread != (Runnable<Timer> *)0x0) {
    return;
  }
  reset(this);
  this_00 = (Runnable<Timer> *)
            operator_new(0x58,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Timer.cpp"
                         ,0x5e);
  JHThread::Runnable<Timer>::Runnable
            (this_00,"clockThread",this,(thread_main_type)clockHandler,false,0);
  this->mClockThread = this_00;
  JHThread::Thread::Start((Thread *)this_00);
  return;
}

Assistant:

void Timer::start()
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	// If the clock thread is already running then the
	if (mClockThread != NULL)
		return;
	
	// Because we don't prevent additions to our timer list during
	// periods where the timer is stopped we need to reset, which
	// clears the timeout list and resets ticks to 0
	reset();
	
	mClockThread = jh_new Runnable<Timer>("clockThread",
										  this,
										  &Timer::clockHandler);
	mClockThread->Start();
	
}